

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation_state.cpp
# Opt level: O3

bool __thiscall
spvtools::val::ValidationState_t::IsValidStorageClass
          (ValidationState_t *this,StorageClass storage_class)

{
  bool bVar1;
  bool bVar2;
  
  bVar1 = spvIsVulkanEnv(this->context_->target_env);
  bVar2 = true;
  if (bVar1) {
    if ((int)storage_class < 0x13cc) {
      if ((storage_class < (StorageBuffer|Input)) && ((0x1adfU >> (storage_class & 0x1f) & 1) != 0))
      {
        return true;
      }
      if (storage_class == StorageClassTileImageEXT) {
        return true;
      }
    }
    else {
      if ((storage_class - CallableDataKHR < 0x3a) &&
         ((0x20000000020cc03U >> ((ulong)(storage_class - CallableDataKHR) & 0x3f) & 1) != 0)) {
        return true;
      }
      if (storage_class == NodePayloadAMDX) {
        return true;
      }
      if (storage_class == StorageClassTaskPayloadWorkgroupEXT) {
        return true;
      }
    }
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool ValidationState_t::IsValidStorageClass(
    spv::StorageClass storage_class) const {
  if (spvIsVulkanEnv(context()->target_env)) {
    switch (storage_class) {
      case spv::StorageClass::UniformConstant:
      case spv::StorageClass::Uniform:
      case spv::StorageClass::StorageBuffer:
      case spv::StorageClass::Input:
      case spv::StorageClass::Output:
      case spv::StorageClass::Image:
      case spv::StorageClass::Workgroup:
      case spv::StorageClass::Private:
      case spv::StorageClass::Function:
      case spv::StorageClass::PushConstant:
      case spv::StorageClass::PhysicalStorageBuffer:
      case spv::StorageClass::RayPayloadKHR:
      case spv::StorageClass::IncomingRayPayloadKHR:
      case spv::StorageClass::HitAttributeKHR:
      case spv::StorageClass::CallableDataKHR:
      case spv::StorageClass::IncomingCallableDataKHR:
      case spv::StorageClass::ShaderRecordBufferKHR:
      case spv::StorageClass::TaskPayloadWorkgroupEXT:
      case spv::StorageClass::HitObjectAttributeNV:
      case spv::StorageClass::TileImageEXT:
      case spv::StorageClass::NodePayloadAMDX:
        return true;
      default:
        return false;
    }
  }

  return true;
}